

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O2

void Cec3_ManSimAlloc(Gia_Man_t *p,int nWords)

{
  Vec_Wrd_t *pVVar1;
  int nCap;
  long lVar2;
  
  Vec_WrdFreeP(&p->vSims);
  Vec_WrdFreeP(&p->vSimsPi);
  lVar2 = (long)p->nObjs * (long)nWords;
  nCap = (int)lVar2;
  pVVar1 = Vec_WrdAlloc(nCap);
  pVVar1->nSize = nCap;
  memset(pVVar1->pArray,0,lVar2 * 8);
  p->vSims = pVVar1;
  pVVar1 = Vec_WrdAlloc(p->vCis->nSize * nWords * 4);
  p->vSimsPi = pVVar1;
  p->nSimWords = nWords;
  return;
}

Assistant:

void Cec3_ManSimAlloc( Gia_Man_t * p, int nWords )
{
    Vec_WrdFreeP( &p->vSims );
    Vec_WrdFreeP( &p->vSimsPi );
    p->vSims   = Vec_WrdStart( Gia_ManObjNum(p) * nWords );
    p->vSimsPi = Vec_WrdAlloc( Gia_ManCiNum(p) * nWords * 4 ); // storage for CI patterns
    p->nSimWords = nWords;
}